

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O1

void __thiscall
DenseHashMapIfaceTest_TryEmplace_Test::TestBody(DenseHashMapIfaceTest_TryEmplace_Test *this)

{
  pointer pcVar1;
  undefined8 uVar2;
  value_type *pvVar3;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var4;
  string *this_00;
  char *pcVar5;
  pair<const_int,_A> pVar6;
  tuple<int_&&> *args_2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  pair<google::dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>,_bool>
  p;
  undefined1 local_d8 [8];
  undefined1 local_d0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  AssertHelper local_a0;
  pair<google::dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>,_bool>
  local_98;
  undefined4 local_6c;
  dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  dStack_68;
  
  pcVar5 = local_d8;
  dStack_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  consider_shrink_ = false;
  dStack_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  dStack_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  enlarge_factor_ = 0.5;
  dStack_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  shrink_factor_ = 0.2;
  dStack_68.num_deleted = 0;
  dStack_68.num_elements = 0;
  dStack_68.num_buckets = 0x20;
  dStack_68.table = (pointer)0x0;
  dStack_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  enlarge_threshold_ = 0x10;
  dStack_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  shrink_threshold_ = 6;
  dStack_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_empty_ =
       true;
  dStack_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_deleted_
       = false;
  dStack_68.key_info.delkey = 0;
  dStack_68.key_info.empty_key = 0;
  dStack_68.table = (pointer)malloc(0x100);
  memset(dStack_68.table,0,0x100);
  A::copy_ctor = 0;
  A::copy_assign = 0;
  A::move_ctor = 0;
  A::move_assign = 0;
  local_d8._0_4_ = 10;
  local_a0.data_._0_4_ = 1.4013e-43;
  google::
  dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  ::resize_delta(&dStack_68,1);
  args_2 = (tuple<int_&&> *)local_d0;
  local_d0._0_8_ = &local_a0;
  local_d0._16_8_ =
       (dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
        *)local_d8;
  google::
  dense_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
  ::insert_noresize<int,std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<int&&>>
            (&local_98,
             (dense_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
              *)&dStack_68,(int *)local_d8,(piecewise_construct_t *)&std::piecewise_construct,
             (tuple<int_&&> *)(local_d0 + 0x10),args_2);
  uVar2 = local_d0._0_8_;
  local_d0[0] = local_98.second;
  local_d0._8_8_ =
       (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )0x0;
  if (local_98.second == false) {
    testing::Message::Message((Message *)local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)(local_d0 + 0x10),(internal *)local_d0,(AssertionResult *)"p.second",
               "false","true",(char *)args_2);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
               ,0x28a,(char *)local_d0._16_8_);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_d8);
LAB_00a56522:
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._16_8_ != &local_b0) {
      operator_delete((void *)local_d0._16_8_);
    }
    _Var4._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._8_8_;
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_d8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      (**(code **)(*(long *)local_d8 + 8))();
      _Var4._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._8_8_;
    }
  }
  else {
    local_d0._4_4_ = SUB84(uVar2,4);
    local_d0._0_4_ = 10;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_d0 + 0x10),"10","p.first->first",(int *)local_d0,
               &(local_98.first.pos)->first);
    uVar2 = local_d0._24_8_;
    if (local_d0[0x10] == '\0') {
      testing::Message::Message((Message *)local_d0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._24_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pVar6 = (pair<const_int,_A>)0xafc493;
      }
      else {
        pVar6 = *(pair<const_int,_A> *)local_d0._24_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                 ,0x28b,(char *)pVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)local_d0);
    }
    else {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._24_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*(pointer *)local_d0._24_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_d0._24_8_ + 0x10)) {
          operator_delete(*(pointer *)local_d0._24_8_);
        }
        operator_delete((void *)uVar2);
      }
      local_d0._0_4_ = 100;
      testing::internal::CmpHelperEQ<int,A>
                ((internal *)(local_d0 + 0x10),"100","p.first->second",(int *)local_d0,
                 (A *)((long)local_98.first.pos + 4));
      uVar2 = local_d0._24_8_;
      if (local_d0[0x10] == '\0') {
        testing::Message::Message((Message *)local_d0);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._24_8_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = *(char **)local_d0._24_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                   ,0x28c,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)local_d0);
      }
      else {
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._24_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          if (*(pair<const_int,_A> *)local_d0._24_8_ != (pair<const_int,_A>)(local_d0._24_8_ + 0x10)
             ) {
            operator_delete((void *)*(pair<const_int,_A> *)local_d0._24_8_);
          }
          operator_delete((void *)uVar2);
        }
        local_d0._0_4_ = 100;
        local_d8._0_4_ = 10;
        pvVar3 = google::
                 dense_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
                 ::find_or_insert<A,int>
                           ((dense_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
                             *)&dStack_68,(int *)local_d8);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)(local_d0 + 0x10),"100","h[10]._i",(int *)local_d0,
                   &(pvVar3->second)._i);
        uVar2 = local_d0._24_8_;
        if (local_d0[0x10] == '\0') {
          testing::Message::Message((Message *)local_d0);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._24_8_
              == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pVar6 = (pair<const_int,_A>)0xafc493;
          }
          else {
            pVar6 = *(pair<const_int,_A> *)local_d0._24_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_d8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                     ,0x28d,(char *)pVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)local_d0);
        }
        else {
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._24_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*(pointer *)local_d0._24_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_d0._24_8_ + 0x10)) {
              operator_delete(*(pointer *)local_d0._24_8_);
            }
            operator_delete((void *)uVar2);
          }
          local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)(local_d0 + 0x10),"0","A::copy_ctor",(int *)local_d0,&A::copy_ctor)
          ;
          uVar2 = local_d0._24_8_;
          if (local_d0[0x10] == '\0') {
            testing::Message::Message((Message *)local_d0);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._24_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pVar6 = (pair<const_int,_A>)0xafc493;
            }
            else {
              pVar6 = *(pair<const_int,_A> *)local_d0._24_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_d8,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                       ,0x28e,(char *)pVar6);
            testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)local_d0)
            ;
          }
          else {
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._24_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*(pointer *)local_d0._24_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_d0._24_8_ + 0x10)) {
                operator_delete(*(pointer *)local_d0._24_8_);
              }
              operator_delete((void *)uVar2);
            }
            local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)(local_d0 + 0x10),"0","A::copy_assign",(int *)local_d0,
                       &A::copy_assign);
            uVar2 = local_d0._24_8_;
            if (local_d0[0x10] == '\0') {
              testing::Message::Message((Message *)local_d0);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_d0._24_8_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar5 = "";
              }
              else {
                pcVar5 = *(char **)local_d0._24_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_d8,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                         ,0x28f,pcVar5);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_d8,(Message *)local_d0);
            }
            else {
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_d0._24_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                if (*(pair<const_int,_A> *)local_d0._24_8_ !=
                    (pair<const_int,_A>)(local_d0._24_8_ + 0x10)) {
                  operator_delete((void *)*(pair<const_int,_A> *)local_d0._24_8_);
                }
                operator_delete((void *)uVar2);
              }
              local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)(local_d0 + 0x10),"0","A::move_ctor",(int *)local_d0,
                         &A::move_ctor);
              uVar2 = local_d0._24_8_;
              if (local_d0[0x10] == '\0') {
                testing::Message::Message((Message *)local_d0);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_d0._24_8_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar5 = "";
                }
                else {
                  pcVar5 = *(char **)local_d0._24_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_d8,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                           ,0x290,pcVar5);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_d8,(Message *)local_d0);
              }
              else {
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_d0._24_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  if (*(pair<const_int,_A> *)local_d0._24_8_ !=
                      (pair<const_int,_A>)(local_d0._24_8_ + 0x10)) {
                    operator_delete((void *)*(pair<const_int,_A> *)local_d0._24_8_);
                  }
                  operator_delete((void *)uVar2);
                }
                local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)(local_d0 + 0x10),"0","A::move_assign",(int *)local_d0,
                           &A::move_assign);
                uVar2 = local_d0._24_8_;
                if (local_d0[0x10] == '\0') {
                  testing::Message::Message((Message *)local_d0);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_d0._24_8_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar5 = "";
                  }
                  else {
                    pcVar5 = *(char **)local_d0._24_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)local_d8,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                             ,0x291,pcVar5);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)local_d8,(Message *)local_d0);
                }
                else {
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_d0._24_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    if (*(pair<const_int,_A> *)local_d0._24_8_ !=
                        (pair<const_int,_A>)(local_d0._24_8_ + 0x10)) {
                      operator_delete((void *)*(pair<const_int,_A> *)local_d0._24_8_);
                    }
                    operator_delete((void *)uVar2);
                  }
                  A::copy_ctor = 0;
                  A::copy_assign = 0;
                  A::move_ctor = 0;
                  A::move_assign = 0;
                  local_a0.data_._0_4_ = 1.4013e-44;
                  local_6c = 0x65;
                  google::
                  dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                  ::resize_delta(&dStack_68,1);
                  local_d8 = (undefined1  [8])&local_6c;
                  local_d0._0_8_ = &local_a0;
                  google::
                  dense_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
                  ::
                  insert_noresize<int,std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<int&&>>
                            ((pair<google::dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>,_bool>
                              *)(local_d0 + 0x10),
                             (dense_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
                              *)&dStack_68,(int *)&local_a0,
                             (piecewise_construct_t *)&std::piecewise_construct,
                             (tuple<int_&&> *)local_d0,(tuple<int_&&> *)local_d8);
                  uVar2 = local_d0._0_8_;
                  local_98.first.ht =
                       (dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                        *)local_d0._16_8_;
                  local_98.first.pos = (pointer)local_d0._24_8_;
                  local_98.first.end = (pointer)local_b0._M_allocated_capacity;
                  local_98.second = (bool)local_b0._M_local_buf[8];
                  local_d0._0_8_ = CONCAT71(local_d0._1_7_,local_b0._M_local_buf[8]) ^ 1;
                  local_d0._8_8_ =
                       (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                  if (local_b0._M_local_buf[8] != '\0') {
                    testing::Message::Message((Message *)local_d8);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)(local_d0 + 0x10),(internal *)local_d0,
                               (AssertionResult *)"p.second","true","false",pcVar5);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_a0,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                               ,0x297,(char *)local_d0._16_8_);
                    testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_d8);
                    goto LAB_00a56522;
                  }
                  local_d0._4_4_ = SUB84(uVar2,4);
                  local_d0._0_4_ = 10;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)(local_d0 + 0x10),"10","p.first->first",(int *)local_d0,
                             (int *)local_d0._24_8_);
                  uVar2 = local_d0._24_8_;
                  if (local_d0[0x10] == '\0') {
                    testing::Message::Message((Message *)local_d0);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_d0._24_8_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar5 = "";
                    }
                    else {
                      pcVar5 = *(char **)local_d0._24_8_;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)local_d8,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                               ,0x298,pcVar5);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)local_d8,(Message *)local_d0);
                  }
                  else {
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_d0._24_8_ !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      if (*(pair<const_int,_A> *)local_d0._24_8_ !=
                          (pair<const_int,_A>)(local_d0._24_8_ + 0x10)) {
                        operator_delete((void *)*(pair<const_int,_A> *)local_d0._24_8_);
                      }
                      operator_delete((void *)uVar2);
                    }
                    local_d0._0_4_ = 100;
                    testing::internal::CmpHelperEQ<int,A>
                              ((internal *)(local_d0 + 0x10),"100","p.first->second",(int *)local_d0
                               ,(A *)((long)local_98.first.pos + 4));
                    uVar2 = local_d0._24_8_;
                    if (local_d0[0x10] == '\0') {
                      testing::Message::Message((Message *)local_d0);
                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_d0._24_8_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar5 = "";
                      }
                      else {
                        pcVar5 = *(char **)local_d0._24_8_;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)local_d8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                 ,0x299,pcVar5);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)local_d8,(Message *)local_d0);
                    }
                    else {
                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_d0._24_8_ !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        if (*(pair<const_int,_A> *)local_d0._24_8_ !=
                            (pair<const_int,_A>)(local_d0._24_8_ + 0x10)) {
                          operator_delete((void *)*(pair<const_int,_A> *)local_d0._24_8_);
                        }
                        operator_delete((void *)uVar2);
                      }
                      local_d0._0_4_ = 100;
                      local_d8._0_4_ = 10;
                      pvVar3 = google::
                               dense_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
                               ::find_or_insert<A,int>
                                         ((dense_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
                                           *)&dStack_68,(int *)local_d8);
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)(local_d0 + 0x10),"100","h[10]._i",(int *)local_d0,
                                 &(pvVar3->second)._i);
                      uVar2 = local_d0._24_8_;
                      if (local_d0[0x10] != '\0') {
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_d0._24_8_ !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)*(pointer *)local_d0._24_8_ !=
                              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(local_d0._24_8_ + 0x10)) {
                            operator_delete(*(pointer *)local_d0._24_8_);
                          }
                          operator_delete((void *)uVar2);
                        }
                        local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
                        testing::internal::CmpHelperEQ<int,int>
                                  ((internal *)(local_d0 + 0x10),"0","A::copy_ctor",(int *)local_d0,
                                   &A::copy_ctor);
                        if (local_d0[0x10] == '\0') {
                          testing::Message::Message((Message *)local_d0);
                          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_d0._24_8_ ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar5 = "";
                          }
                          else {
                            pcVar5 = *(char **)local_d0._24_8_;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)local_d8,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                     ,0x29b,pcVar5);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)local_d8,(Message *)local_d0);
LAB_00a56f7f:
                          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
                          if ((long *)local_d0._0_8_ != (long *)0x0) {
                            (**(code **)(*(long *)local_d0._0_8_ + 8))();
                          }
LAB_00a56f97:
                          this_00 = (string *)(local_d0 + 0x10);
                        }
                        else {
                          testing::AssertionResult::~AssertionResult
                                    ((AssertionResult *)(local_d0 + 0x10));
                          local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)(local_d0 + 0x10),"0","A::copy_assign",
                                     (int *)local_d0,&A::copy_assign);
                          if (local_d0[0x10] == '\0') {
                            testing::Message::Message((Message *)local_d0);
                            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_d0._24_8_ ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pVar6 = (pair<const_int,_A>)0xafc493;
                            }
                            else {
                              pVar6 = *(pair<const_int,_A> *)local_d0._24_8_;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)local_d8,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                       ,0x29c,(char *)pVar6);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)local_d8,(Message *)local_d0);
                            goto LAB_00a56f7f;
                          }
                          testing::AssertionResult::~AssertionResult
                                    ((AssertionResult *)(local_d0 + 0x10));
                          local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)(local_d0 + 0x10),"0","A::move_ctor",
                                     (int *)local_d0,&A::move_ctor);
                          if (local_d0[0x10] == '\0') {
                            testing::Message::Message((Message *)local_d0);
                            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_d0._24_8_ ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar5 = "";
                            }
                            else {
                              pcVar5 = *(char **)local_d0._24_8_;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)local_d8,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                       ,0x29d,pcVar5);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)local_d8,(Message *)local_d0);
                            goto LAB_00a56f7f;
                          }
                          testing::AssertionResult::~AssertionResult
                                    ((AssertionResult *)(local_d0 + 0x10));
                          local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)(local_d0 + 0x10),"0","A::move_assign",
                                     (int *)local_d0,&A::move_assign);
                          if (local_d0[0x10] == '\0') {
                            testing::Message::Message((Message *)local_d0);
                            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_d0._24_8_ ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar5 = "";
                            }
                            else {
                              pcVar5 = *(char **)local_d0._24_8_;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)local_d8,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                       ,0x29e,pcVar5);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)local_d8,(Message *)local_d0);
                            goto LAB_00a56f7f;
                          }
                          testing::AssertionResult::~AssertionResult
                                    ((AssertionResult *)(local_d0 + 0x10));
                          A::copy_ctor = 0;
                          A::copy_assign = 0;
                          A::move_ctor = 0;
                          A::move_assign = 0;
                          local_d0._0_4_ = 0x14;
                          local_d8._0_4_ = 200;
                          google::
                          dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                          ::try_emplace<A>((pair<google::dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>,_bool>
                                            *)(local_d0 + 0x10),
                                           (dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                            *)&dStack_68,(key_type *)local_d0,(A *)local_d8);
                          local_98.first.end = (pointer)local_b0._M_allocated_capacity;
                          local_98.first.ht =
                               (dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                *)local_d0._16_8_;
                          local_98.first.pos = (pointer)local_d0._24_8_;
                          local_98.second = (bool)local_b0._M_local_buf[8];
                          local_d0[0] = local_b0._M_local_buf[8];
                          local_d0._8_8_ =
                               (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )0x0;
                          if (local_b0._M_local_buf[8] != '\0') {
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
                            local_d0._0_4_ = 0x14;
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)(local_d0 + 0x10),"20","p.first->first",
                                       (int *)local_d0,&(local_98.first.pos)->first);
                            if (local_d0[0x10] == '\0') {
                              testing::Message::Message((Message *)local_d0);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0._24_8_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar5 = "";
                              }
                              else {
                                pcVar5 = *(char **)local_d0._24_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)local_d8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                         ,0x2a5,pcVar5);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)local_d8,(Message *)local_d0);
                              goto LAB_00a56f7f;
                            }
                            testing::AssertionResult::~AssertionResult
                                      ((AssertionResult *)(local_d0 + 0x10));
                            local_d0._0_4_ = 200;
                            testing::internal::CmpHelperEQ<int,A>
                                      ((internal *)(local_d0 + 0x10),"200","p.first->second",
                                       (int *)local_d0,(A *)((long)local_98.first.pos + 4));
                            if (local_d0[0x10] == '\0') {
                              testing::Message::Message((Message *)local_d0);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0._24_8_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar5 = "";
                              }
                              else {
                                pcVar5 = *(char **)local_d0._24_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)local_d8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                         ,0x2a6,pcVar5);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)local_d8,(Message *)local_d0);
                              goto LAB_00a56f7f;
                            }
                            testing::AssertionResult::~AssertionResult
                                      ((AssertionResult *)(local_d0 + 0x10));
                            local_d0._0_4_ = 0x14;
                            pvVar3 = google::
                                     dense_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
                                     ::find_or_insert<A,int>
                                               ((dense_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
                                                 *)&dStack_68,(int *)local_d0);
                            local_d8._0_4_ = 200;
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)(local_d0 + 0x10),"h[20]._i","200",
                                       &(pvVar3->second)._i,(int *)local_d8);
                            if (local_d0[0x10] == '\0') {
                              testing::Message::Message((Message *)local_d0);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0._24_8_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pVar6 = (pair<const_int,_A>)0xafc493;
                              }
                              else {
                                pVar6 = *(pair<const_int,_A> *)local_d0._24_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)local_d8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                         ,0x2a7,(char *)pVar6);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)local_d8,(Message *)local_d0);
                              goto LAB_00a56f7f;
                            }
                            testing::AssertionResult::~AssertionResult
                                      ((AssertionResult *)(local_d0 + 0x10));
                            local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)(local_d0 + 0x10),"0","A::copy_ctor",
                                       (int *)local_d0,&A::copy_ctor);
                            if (local_d0[0x10] == '\0') {
                              testing::Message::Message((Message *)local_d0);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0._24_8_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pVar6 = (pair<const_int,_A>)0xafc493;
                              }
                              else {
                                pVar6 = *(pair<const_int,_A> *)local_d0._24_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)local_d8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                         ,0x2a8,(char *)pVar6);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)local_d8,(Message *)local_d0);
                              goto LAB_00a56f7f;
                            }
                            testing::AssertionResult::~AssertionResult
                                      ((AssertionResult *)(local_d0 + 0x10));
                            local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)(local_d0 + 0x10),"0","A::copy_assign",
                                       (int *)local_d0,&A::copy_assign);
                            if (local_d0[0x10] == '\0') {
                              testing::Message::Message((Message *)local_d0);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0._24_8_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pVar6 = (pair<const_int,_A>)0xafc493;
                              }
                              else {
                                pVar6 = *(pair<const_int,_A> *)local_d0._24_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)local_d8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                         ,0x2a9,(char *)pVar6);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)local_d8,(Message *)local_d0);
                              goto LAB_00a56f7f;
                            }
                            testing::AssertionResult::~AssertionResult
                                      ((AssertionResult *)(local_d0 + 0x10));
                            local_d0._0_4_ = 1;
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)(local_d0 + 0x10),"1","A::move_ctor",
                                       (int *)local_d0,&A::move_ctor);
                            if (local_d0[0x10] == '\0') {
                              testing::Message::Message((Message *)local_d0);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0._24_8_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pVar6 = (pair<const_int,_A>)0xafc493;
                              }
                              else {
                                pVar6 = *(pair<const_int,_A> *)local_d0._24_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)local_d8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                         ,0x2aa,(char *)pVar6);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)local_d8,(Message *)local_d0);
                              goto LAB_00a56f7f;
                            }
                            testing::AssertionResult::~AssertionResult
                                      ((AssertionResult *)(local_d0 + 0x10));
                            local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)(local_d0 + 0x10),"0","A::move_assign",
                                       (int *)local_d0,&A::move_assign);
                            if (local_d0[0x10] == '\0') {
                              testing::Message::Message((Message *)local_d0);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0._24_8_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pVar6 = (pair<const_int,_A>)0xafc493;
                              }
                              else {
                                pVar6 = *(pair<const_int,_A> *)local_d0._24_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)local_d8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                         ,0x2ab,(char *)pVar6);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)local_d8,(Message *)local_d0);
                              goto LAB_00a56f7f;
                            }
                            testing::AssertionResult::~AssertionResult
                                      ((AssertionResult *)(local_d0 + 0x10));
                            A::copy_ctor = 0;
                            A::copy_assign = 0;
                            A::move_ctor = 0;
                            A::move_assign = 0;
                            local_d0._0_4_ = 0x14;
                            local_d8._0_4_ = 0xc9;
                            google::
                            dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                            ::try_emplace<A>((pair<google::dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>,_bool>
                                              *)(local_d0 + 0x10),
                                             (dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                              *)&dStack_68,(key_type *)local_d0,(A *)local_d8);
                            local_98.first.end = (pointer)local_b0._M_allocated_capacity;
                            local_98.first.ht =
                                 (dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                  *)local_d0._16_8_;
                            local_98.first.pos = (pointer)local_d0._24_8_;
                            local_98.second = (bool)local_b0._M_local_buf[8];
                            local_d0._0_8_ = CONCAT71(local_d0._1_7_,local_b0._M_local_buf[8]) ^ 1;
                            local_d0._8_8_ =
                                 (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )0x0;
                            if (local_b0._M_local_buf[8] != '\0') {
                              testing::Message::Message((Message *)local_d8);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)(local_d0 + 0x10),(internal *)local_d0,
                                         (AssertionResult *)"p.second","true","false",pcVar5);
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_a0,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                         ,0x2b1,(char *)local_d0._16_8_);
                              testing::internal::AssertHelper::operator=
                                        (&local_a0,(Message *)local_d8);
                              goto LAB_00a56f1f;
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
                            local_d0._0_4_ = 0x14;
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)(local_d0 + 0x10),"20","p.first->first",
                                       (int *)local_d0,&(local_98.first.pos)->first);
                            if (local_d0[0x10] == '\0') {
                              testing::Message::Message((Message *)local_d0);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0._24_8_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pVar6 = (pair<const_int,_A>)0xafc493;
                              }
                              else {
                                pVar6 = *(pair<const_int,_A> *)local_d0._24_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)local_d8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                         ,0x2b2,(char *)pVar6);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)local_d8,(Message *)local_d0);
                              goto LAB_00a56f7f;
                            }
                            testing::AssertionResult::~AssertionResult
                                      ((AssertionResult *)(local_d0 + 0x10));
                            local_d0._0_4_ = 200;
                            testing::internal::CmpHelperEQ<int,A>
                                      ((internal *)(local_d0 + 0x10),"200","p.first->second",
                                       (int *)local_d0,(A *)((long)local_98.first.pos + 4));
                            if (local_d0[0x10] == '\0') {
                              testing::Message::Message((Message *)local_d0);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0._24_8_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pVar6 = (pair<const_int,_A>)0xafc493;
                              }
                              else {
                                pVar6 = *(pair<const_int,_A> *)local_d0._24_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)local_d8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                         ,0x2b3,(char *)pVar6);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)local_d8,(Message *)local_d0);
                              goto LAB_00a56f7f;
                            }
                            testing::AssertionResult::~AssertionResult
                                      ((AssertionResult *)(local_d0 + 0x10));
                            local_d0._0_4_ = 0x14;
                            pvVar3 = google::
                                     dense_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
                                     ::find_or_insert<A,int>
                                               ((dense_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
                                                 *)&dStack_68,(int *)local_d0);
                            local_d8._0_4_ = 200;
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)(local_d0 + 0x10),"h[20]._i","200",
                                       &(pvVar3->second)._i,(int *)local_d8);
                            if (local_d0[0x10] == '\0') {
                              testing::Message::Message((Message *)local_d0);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0._24_8_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar5 = "";
                              }
                              else {
                                pcVar5 = *(char **)local_d0._24_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)local_d8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                         ,0x2b4,pcVar5);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)local_d8,(Message *)local_d0);
                              goto LAB_00a56f7f;
                            }
                            testing::AssertionResult::~AssertionResult
                                      ((AssertionResult *)(local_d0 + 0x10));
                            local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)(local_d0 + 0x10),"0","A::copy_ctor",
                                       (int *)local_d0,&A::copy_ctor);
                            if (local_d0[0x10] == '\0') {
                              testing::Message::Message((Message *)local_d0);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0._24_8_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar5 = "";
                              }
                              else {
                                pcVar5 = *(char **)local_d0._24_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)local_d8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                         ,0x2b5,pcVar5);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)local_d8,(Message *)local_d0);
                              goto LAB_00a56f7f;
                            }
                            testing::AssertionResult::~AssertionResult
                                      ((AssertionResult *)(local_d0 + 0x10));
                            local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)(local_d0 + 0x10),"0","A::copy_assign",
                                       (int *)local_d0,&A::copy_assign);
                            if (local_d0[0x10] == '\0') {
                              testing::Message::Message((Message *)local_d0);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0._24_8_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pVar6 = (pair<const_int,_A>)0xafc493;
                              }
                              else {
                                pVar6 = *(pair<const_int,_A> *)local_d0._24_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)local_d8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                         ,0x2b6,(char *)pVar6);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)local_d8,(Message *)local_d0);
                              goto LAB_00a56f7f;
                            }
                            testing::AssertionResult::~AssertionResult
                                      ((AssertionResult *)(local_d0 + 0x10));
                            local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)(local_d0 + 0x10),"0","A::move_ctor",
                                       (int *)local_d0,&A::move_ctor);
                            if (local_d0[0x10] == '\0') {
                              testing::Message::Message((Message *)local_d0);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0._24_8_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar5 = "";
                              }
                              else {
                                pcVar5 = *(char **)local_d0._24_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)local_d8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                         ,0x2b7,pcVar5);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)local_d8,(Message *)local_d0);
                              goto LAB_00a56f7f;
                            }
                            testing::AssertionResult::~AssertionResult
                                      ((AssertionResult *)(local_d0 + 0x10));
                            local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)(local_d0 + 0x10),"0","A::move_assign",
                                       (int *)local_d0,&A::move_assign);
                            if (local_d0[0x10] == '\0') {
                              testing::Message::Message((Message *)local_d0);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0._24_8_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar5 = "";
                              }
                              else {
                                pcVar5 = *(char **)local_d0._24_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)local_d8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                         ,0x2b8,pcVar5);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)local_d8,(Message *)local_d0);
                              goto LAB_00a56f7f;
                            }
                            testing::AssertionResult::~AssertionResult
                                      ((AssertionResult *)(local_d0 + 0x10));
                            A::copy_ctor = 0;
                            A::copy_assign = 0;
                            A::move_ctor = 0;
                            A::move_assign = 0;
                            local_d0._0_4_ = 0x1e;
                            google::
                            dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                            ::try_emplace<>((pair<google::dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>,_bool>
                                             *)(local_d0 + 0x10),
                                            (dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                             *)&dStack_68,(key_type *)local_d0);
                            local_98.first.end = (pointer)local_b0._M_allocated_capacity;
                            local_98.first.ht =
                                 (dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                  *)local_d0._16_8_;
                            local_98.first.pos = (pointer)local_d0._24_8_;
                            local_98.second = (bool)local_b0._M_local_buf[8];
                            local_d0[0] = local_b0._M_local_buf[8];
                            local_d0._8_8_ =
                                 (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )0x0;
                            if (local_b0._M_local_buf[8] == '\0') {
                              testing::Message::Message((Message *)local_d8);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)(local_d0 + 0x10),(internal *)local_d0,
                                         (AssertionResult *)"p.second","false","true",pcVar5);
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_a0,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                         ,0x2be,(char *)local_d0._16_8_);
                              testing::internal::AssertHelper::operator=
                                        (&local_a0,(Message *)local_d8);
                              goto LAB_00a56f1f;
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
                            local_d0._0_4_ = 0x1e;
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)(local_d0 + 0x10),"30","p.first->first",
                                       (int *)local_d0,&(local_98.first.pos)->first);
                            if (local_d0[0x10] == '\0') {
                              testing::Message::Message((Message *)local_d0);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0._24_8_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar5 = "";
                              }
                              else {
                                pcVar5 = *(char **)local_d0._24_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)local_d8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                         ,0x2bf,pcVar5);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)local_d8,(Message *)local_d0);
                              goto LAB_00a56f7f;
                            }
                            testing::AssertionResult::~AssertionResult
                                      ((AssertionResult *)(local_d0 + 0x10));
                            local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
                            testing::internal::CmpHelperEQ<int,A>
                                      ((internal *)(local_d0 + 0x10),"0","p.first->second",
                                       (int *)local_d0,(A *)((long)local_98.first.pos + 4));
                            if (local_d0[0x10] == '\0') {
                              testing::Message::Message((Message *)local_d0);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0._24_8_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar5 = "";
                              }
                              else {
                                pcVar5 = *(char **)local_d0._24_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)local_d8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                         ,0x2c0,pcVar5);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)local_d8,(Message *)local_d0);
                              goto LAB_00a56f7f;
                            }
                            testing::AssertionResult::~AssertionResult
                                      ((AssertionResult *)(local_d0 + 0x10));
                            local_d0._0_4_ = 0x1e;
                            pvVar3 = google::
                                     dense_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
                                     ::find_or_insert<A,int>
                                               ((dense_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
                                                 *)&dStack_68,(int *)local_d0);
                            local_d8 = (undefined1  [8])((ulong)local_d8 & 0xffffffff00000000);
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)(local_d0 + 0x10),"h[30]._i","0",
                                       &(pvVar3->second)._i,(int *)local_d8);
                            if (local_d0[0x10] == '\0') {
                              testing::Message::Message((Message *)local_d0);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0._24_8_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pVar6 = (pair<const_int,_A>)0xafc493;
                              }
                              else {
                                pVar6 = *(pair<const_int,_A> *)local_d0._24_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)local_d8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                         ,0x2c1,(char *)pVar6);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)local_d8,(Message *)local_d0);
                              goto LAB_00a56f7f;
                            }
                            testing::AssertionResult::~AssertionResult
                                      ((AssertionResult *)(local_d0 + 0x10));
                            local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)(local_d0 + 0x10),"0","A::copy_ctor",
                                       (int *)local_d0,&A::copy_ctor);
                            if (local_d0[0x10] == '\0') {
                              testing::Message::Message((Message *)local_d0);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0._24_8_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pVar6 = (pair<const_int,_A>)0xafc493;
                              }
                              else {
                                pVar6 = *(pair<const_int,_A> *)local_d0._24_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)local_d8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                         ,0x2c2,(char *)pVar6);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)local_d8,(Message *)local_d0);
                              goto LAB_00a56f7f;
                            }
                            testing::AssertionResult::~AssertionResult
                                      ((AssertionResult *)(local_d0 + 0x10));
                            local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)(local_d0 + 0x10),"0","A::copy_assign",
                                       (int *)local_d0,&A::copy_assign);
                            if (local_d0[0x10] == '\0') {
                              testing::Message::Message((Message *)local_d0);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0._24_8_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pVar6 = (pair<const_int,_A>)0xafc493;
                              }
                              else {
                                pVar6 = *(pair<const_int,_A> *)local_d0._24_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)local_d8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                         ,0x2c3,(char *)pVar6);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)local_d8,(Message *)local_d0);
                              goto LAB_00a56f7f;
                            }
                            testing::AssertionResult::~AssertionResult
                                      ((AssertionResult *)(local_d0 + 0x10));
                            local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)(local_d0 + 0x10),"0","A::move_ctor",
                                       (int *)local_d0,&A::move_ctor);
                            if (local_d0[0x10] == '\0') {
                              testing::Message::Message((Message *)local_d0);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0._24_8_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pVar6 = (pair<const_int,_A>)0xafc493;
                              }
                              else {
                                pVar6 = *(pair<const_int,_A> *)local_d0._24_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)local_d8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                         ,0x2c4,(char *)pVar6);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)local_d8,(Message *)local_d0);
                              goto LAB_00a56f7f;
                            }
                            testing::AssertionResult::~AssertionResult
                                      ((AssertionResult *)(local_d0 + 0x10));
                            local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)(local_d0 + 0x10),"0","A::move_assign",
                                       (int *)local_d0,&A::move_assign);
                            if (local_d0[0x10] == '\0') {
                              testing::Message::Message((Message *)local_d0);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0._24_8_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pVar6 = (pair<const_int,_A>)0xafc493;
                              }
                              else {
                                pVar6 = *(pair<const_int,_A> *)local_d0._24_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)local_d8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                         ,0x2c5,(char *)pVar6);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)local_d8,(Message *)local_d0);
                              goto LAB_00a56f7f;
                            }
                            goto LAB_00a56f97;
                          }
                          testing::Message::Message((Message *)local_d8);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)(local_d0 + 0x10),(internal *)local_d0,
                                     (AssertionResult *)"p.second","false","true",pcVar5);
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_a0,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                     ,0x2a4,(char *)local_d0._16_8_);
                          testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_d8);
LAB_00a56f1f:
                          testing::internal::AssertHelper::~AssertHelper(&local_a0);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_d0._16_8_ != &local_b0) {
                            operator_delete((void *)local_d0._16_8_);
                          }
                          if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )local_d8 !=
                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0) {
                            (**(code **)(*(long *)local_d8 + 8))();
                          }
                          this_00 = (string *)local_d0;
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)this_00);
                        goto LAB_00a56795;
                      }
                      testing::Message::Message((Message *)local_d0);
                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_d0._24_8_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pVar6 = (pair<const_int,_A>)0xafc493;
                      }
                      else {
                        pVar6 = *(pair<const_int,_A> *)local_d0._24_8_;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)local_d8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                                 ,0x29a,(char *)pVar6);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)local_d8,(Message *)local_d0);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
    _Var4._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._24_8_;
    if ((long *)local_d0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_d0._0_8_ + 8))();
      _Var4._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._24_8_;
    }
  }
  if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )_Var4._M_head_impl !=
      (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )0x0) {
    pcVar1 = ((_Var4._M_head_impl)->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(_Var4._M_head_impl)->field_2) {
      operator_delete(pcVar1);
    }
    operator_delete(_Var4._M_head_impl);
  }
LAB_00a56795:
  if (dStack_68.table != (pointer)0x0) {
    free(dStack_68.table);
  }
  return;
}

Assistant:

TEST(DenseHashMapIfaceTest, TryEmplace)
{
    dense_hash_map<int, A> h;
    h.set_empty_key(0);

    // Test: key does not exist; using user-defined constructor with forwarded argument
    A::reset();
    auto p = h.try_emplace(10, 100);

    ASSERT_TRUE(p.second);
    ASSERT_EQ(10, p.first->first);
    ASSERT_EQ(100, p.first->second);
    ASSERT_EQ(100, h[10]._i);
    ASSERT_EQ(0, A::copy_ctor);
    ASSERT_EQ(0, A::copy_assign);
    ASSERT_EQ(0, A::move_ctor);
    ASSERT_EQ(0, A::move_assign);

    // Test: key exists; using forwarded argument
    A::reset();
    p = h.try_emplace(10, 101);

    ASSERT_FALSE(p.second);
    ASSERT_EQ(10, p.first->first);
    ASSERT_EQ(100, p.first->second);
    ASSERT_EQ(100, h[10]._i);
    ASSERT_EQ(0, A::copy_ctor);
    ASSERT_EQ(0, A::copy_assign);
    ASSERT_EQ(0, A::move_ctor);
    ASSERT_EQ(0, A::move_assign);

    // Test: key does not exist; using move constructor
    A::reset();
    p = h.try_emplace(20, A(200));

    ASSERT_TRUE(p.second);
    ASSERT_EQ(20, p.first->first);
    ASSERT_EQ(200, p.first->second);
    ASSERT_EQ(h[20]._i, 200);
    ASSERT_EQ(0, A::copy_ctor);
    ASSERT_EQ(0, A::copy_assign);
    ASSERT_EQ(1, A::move_ctor);
    ASSERT_EQ(0, A::move_assign);

    // Test: key exists; using move constructor
    A::reset();
    p = h.try_emplace(20, A(201));

    ASSERT_FALSE(p.second);
    ASSERT_EQ(20, p.first->first);
    ASSERT_EQ(200, p.first->second);
    ASSERT_EQ(h[20]._i, 200);
    ASSERT_EQ(0, A::copy_ctor);
    ASSERT_EQ(0, A::copy_assign);
    ASSERT_EQ(0, A::move_ctor);
    ASSERT_EQ(0, A::move_assign);

    // Test: key does not exist; using default constructor
    A::reset();
    p = h.try_emplace(30);

    ASSERT_TRUE(p.second);
    ASSERT_EQ(30, p.first->first);
    ASSERT_EQ(0, p.first->second);
    ASSERT_EQ(h[30]._i, 0);
    ASSERT_EQ(0, A::copy_ctor);
    ASSERT_EQ(0, A::copy_assign);
    ASSERT_EQ(0, A::move_ctor);
    ASSERT_EQ(0, A::move_assign);
}